

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cc
# Opt level: O2

void brotli::EncodeContextMap
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *context_map,size_t num_clusters
               ,size_t *storage_ix,uint8_t *storage)

{
  uint32_t uVar1;
  long lVar2;
  size_t i;
  long lVar3;
  size_t i_1;
  ulong uVar4;
  uint32_t max_run_length_prefix;
  vector<unsigned_int,_std::allocator<unsigned_int>_> rle_symbols;
  vector<unsigned_int,_std::allocator<unsigned_int>_> extra_bits;
  vector<unsigned_int,_std::allocator<unsigned_int>_> transformed_symbols;
  byte local_7c4 [272];
  uint16_t local_6b4 [282];
  uint32_t local_480 [272];
  long local_40;
  undefined8 local_38;
  
  StoreVarLenUint8(num_clusters - 1,storage_ix,storage);
  if (num_clusters != 1) {
    MoveToFrontTransform(&transformed_symbols,context_map);
    rle_symbols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    extra_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    rle_symbols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    rle_symbols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    extra_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    extra_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    max_run_length_prefix = 6;
    RunLengthCodeZeros(&transformed_symbols,&max_run_length_prefix,&rle_symbols,&extra_bits);
    memset(local_480,0,0x448);
    uVar1 = max_run_length_prefix;
    local_38 = 0x7ff0000000000000;
    lVar2 = (long)rle_symbols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)rle_symbols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 2;
    for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
      local_480[rle_symbols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar3]] =
           local_480[rle_symbols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar3]] + 1;
    }
    uVar4 = (ulong)max_run_length_prefix;
    local_40 = lVar2;
    WriteBits(1,(ulong)(uVar4 != 0),storage_ix,storage);
    if (uVar4 != 0) {
      WriteBits(4,(ulong)(uVar1 - 1),storage_ix,storage);
    }
    memset(local_7c4,0,0x330);
    BuildAndStoreHuffmanTree(local_480,num_clusters + uVar4,local_7c4,local_6b4,storage_ix,storage);
    for (uVar4 = 0;
        uVar4 < (ulong)((long)rle_symbols.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)rle_symbols.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2); uVar4 = uVar4 + 1) {
      WriteBits((ulong)local_7c4[rle_symbols.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar4]],
                (ulong)local_6b4[rle_symbols.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar4]],storage_ix,storage
               );
      if (rle_symbols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar4] - 1 < uVar1) {
        WriteBits((ulong)rle_symbols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar4],
                  (ulong)extra_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar4],storage_ix,storage);
      }
    }
    uVar4 = *storage_ix;
    *(ulong *)(storage + (uVar4 >> 3)) = (ulong)storage[uVar4 >> 3] | 1L << ((byte)uVar4 & 7);
    *storage_ix = uVar4 + 1;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&extra_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&rle_symbols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&transformed_symbols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
    ;
  }
  return;
}

Assistant:

void EncodeContextMap(const std::vector<uint32_t>& context_map,
                      size_t num_clusters,
                      size_t* storage_ix, uint8_t* storage) {
  StoreVarLenUint8(num_clusters - 1, storage_ix, storage);

  if (num_clusters == 1) {
    return;
  }

  std::vector<uint32_t> transformed_symbols = MoveToFrontTransform(context_map);
  std::vector<uint32_t> rle_symbols;
  std::vector<uint32_t> extra_bits;
  uint32_t max_run_length_prefix = 6;
  RunLengthCodeZeros(transformed_symbols, &max_run_length_prefix,
                     &rle_symbols, &extra_bits);
  HistogramContextMap symbol_histogram;
  for (size_t i = 0; i < rle_symbols.size(); ++i) {
    symbol_histogram.Add(rle_symbols[i]);
  }
  bool use_rle = max_run_length_prefix > 0;
  WriteBits(1, use_rle, storage_ix, storage);
  if (use_rle) {
    WriteBits(4, max_run_length_prefix - 1, storage_ix, storage);
  }
  EntropyCodeContextMap symbol_code;
  memset(symbol_code.depth_, 0, sizeof(symbol_code.depth_));
  memset(symbol_code.bits_, 0, sizeof(symbol_code.bits_));
  BuildAndStoreHuffmanTree(symbol_histogram.data_,
                           num_clusters + max_run_length_prefix,
                           symbol_code.depth_, symbol_code.bits_,
                           storage_ix, storage);
  for (size_t i = 0; i < rle_symbols.size(); ++i) {
    WriteBits(symbol_code.depth_[rle_symbols[i]],
              symbol_code.bits_[rle_symbols[i]],
              storage_ix, storage);
    if (rle_symbols[i] > 0 && rle_symbols[i] <= max_run_length_prefix) {
      WriteBits(rle_symbols[i], extra_bits[i], storage_ix, storage);
    }
  }
  WriteBits(1, 1, storage_ix, storage);  // use move-to-front
}